

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O1

void SimpleLoggerMgr::compressWorker(void)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  int iVar3;
  EVP_PKEY_CTX *ctx;
  undefined4 extraout_var;
  _List_node_base *p_Var4;
  atomic<SimpleLoggerMgr_*> this;
  
  ctx = (EVP_PKEY_CTX *)pthread_self();
  pthread_setname_np((pthread_t)ctx,"sl_compressor");
  this = instance;
  if (instance._M_b._M_p == (__pointer_type)0x0) {
    iVar3 = init(ctx);
    this._M_b._M_p = (__base_type)CONCAT44(extraout_var,iVar3);
  }
  if (((((__pointer_type)this._M_b._M_p)->termination)._M_base._M_i & 1U) != 0) {
    return;
  }
  do {
    sleepCompressor((SimpleLoggerMgr *)this._M_b._M_p,500);
    do {
      iVar3 = pthread_mutex_lock((pthread_mutex_t *)
                                 &((__pointer_type)this._M_b._M_p)->pendingCompElemsLock);
      if (iVar3 != 0) {
        std::__throw_system_error(iVar3);
      }
      p_Var2 = (((__pointer_type)this._M_b._M_p)->pendingCompElems).
               super__List_base<SimpleLoggerMgr::CompElem_*,_std::allocator<SimpleLoggerMgr::CompElem_*>_>
               ._M_impl._M_node.super__List_node_base._M_next;
      if (p_Var2 == (_List_node_base *)&((__pointer_type)this._M_b._M_p)->pendingCompElems) {
        p_Var4 = (_List_node_base *)0x0;
      }
      else {
        p_Var4 = p_Var2[1]._M_next;
        psVar1 = &(((__pointer_type)this._M_b._M_p)->pendingCompElems).
                  super__List_base<SimpleLoggerMgr::CompElem_*,_std::allocator<SimpleLoggerMgr::CompElem_*>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var2);
      }
      pthread_mutex_unlock
                ((pthread_mutex_t *)&((__pointer_type)this._M_b._M_p)->pendingCompElemsLock);
      if (p_Var4 != (_List_node_base *)0x0) {
        SimpleLogger::doCompression((SimpleLogger *)p_Var4->_M_prev,(size_t)p_Var4->_M_next);
        operator_delete(p_Var4);
      }
      if (((((__pointer_type)this._M_b._M_p)->termination)._M_base._M_i & 1U) != 0) {
        return;
      }
    } while (p_Var4 != (_List_node_base *)0x0);
  } while( true );
}

Assistant:

void SimpleLoggerMgr::compressWorker() {
#ifdef __linux__
    pthread_setname_np(pthread_self(), "sl_compressor");
#endif
    SimpleLoggerMgr* mgr = SimpleLoggerMgr::get();
    bool sleep_next_time = true;
    while (!mgr->chkTermination()) {
        // Every 500ms.
        size_t sub_ms = 500;
        if (sleep_next_time) {
            mgr->sleepCompressor(sub_ms);
        }
        sleep_next_time = true;

        CompElem* elem = nullptr;
        {   std::lock_guard<std::mutex> l(mgr->pendingCompElemsLock);
            auto entry = mgr->pendingCompElems.begin();
            if (entry != mgr->pendingCompElems.end()) {
                elem = *entry;
                mgr->pendingCompElems.erase(entry);
            }
        }

        if (elem) {
            elem->targetLogger->doCompression(elem->fileNum);
            delete elem;
            // Continuous compression if pending item exists.
            sleep_next_time = false;
        }
    }
}